

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glvnd.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  int iVar1;
  long lVar2;
  code *pcVar3;
  long lVar4;
  
  lVar2 = dlopen("libGLX.so.0",2);
  if (lVar2 == 0) {
    iVar1 = 0x7d;
  }
  else {
    pcVar3 = (code *)dlsym(lVar2,"glXGetProcAddress");
    if (pcVar3 == (code *)0x0) {
      __assert_fail("pfnglXGetProcAddress != nullptr",
                    "/workspace/llm4binary/github/license_c_cmakelists/apitrace[P]apitrace-tests/apps/gl/glvnd.cpp"
                    ,0x34,"int main(int, char **)");
    }
    (*pcVar3)("glClear");
    lVar4 = dlopen("libOpenGL.so.0",2);
    if (lVar4 == 0) {
      __assert_fail("libOpenGL != nullptr",
                    "/workspace/llm4binary/github/license_c_cmakelists/apitrace[P]apitrace-tests/apps/gl/glvnd.cpp"
                    ,0x38,"int main(int, char **)");
    }
    pcVar3 = (code *)dlsym(lVar4,"glClearColor");
    if (pcVar3 == (code *)0x0) {
      __assert_fail("pfnClearColor !=0",
                    "/workspace/llm4binary/github/license_c_cmakelists/apitrace[P]apitrace-tests/apps/gl/glvnd.cpp"
                    ,0x3c,"int main(int, char **)");
    }
    (*pcVar3)(0x3e800000,0x3f000000,0x3f400000,0x3f800000);
    dlclose(lVar4);
    dlclose(lVar2);
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int
main(int argc, char **argv)
{
    void *libGLX = dlopen("libGLX.so.0", RTLD_NOW | RTLD_LOCAL);
    if (libGLX == nullptr) {
        return EXIT_SKIP;
    }

    PFNGLXGETPROCADDRESSPROC pfnglXGetProcAddress = (PFNGLXGETPROCADDRESSPROC)dlsym(libGLX, "glXGetProcAddress");
    assert(pfnglXGetProcAddress != nullptr);
    pfnglXGetProcAddress((const GLubyte *)"glClear");

    void *libOpenGL = dlopen("libOpenGL.so.0", RTLD_NOW | RTLD_LOCAL);
    assert(libOpenGL != nullptr);

    typedef void (APIENTRY *PFNGLCLEARCOLOR)(GLfloat, GLfloat, GLfloat, GLfloat);
    PFNGLCLEARCOLOR pfnClearColor = (PFNGLCLEARCOLOR)dlsym(libOpenGL, "glClearColor");
    assert(pfnClearColor !=0 );

    pfnClearColor(0.25, 0.5, 0.75, 1.0);

    dlclose(libOpenGL);
    dlclose(libGLX);

    return 0;
}